

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

void rest_engravings(memfile *mf,level *lev)

{
  int8_t iVar1;
  uint len;
  engr *peVar2;
  uint lth;
  engr *enext;
  engr *eprev;
  engr *ep;
  level *lev_local;
  memfile *mf_local;
  
  mfmagic_check(mf,0x52474e45);
  lev->lev_engr = (engr *)0x0;
  while( true ) {
    len = mread32(mf);
    if (len == 0) {
      enext = (engr *)0x0;
      eprev = lev->lev_engr;
      while (eprev != (engr *)0x0) {
        peVar2 = eprev->nxt_engr;
        eprev->nxt_engr = enext;
        enext = eprev;
        eprev = peVar2;
      }
      lev->lev_engr = enext;
      return;
    }
    if (0x100 < len) break;
    peVar2 = (engr *)malloc((ulong)len + 0x28);
    peVar2->engr_lth = len;
    iVar1 = mread8(mf);
    peVar2->engr_x = iVar1;
    iVar1 = mread8(mf);
    peVar2->engr_y = iVar1;
    iVar1 = mread8(mf);
    peVar2->engr_type = iVar1;
    peVar2->engr_txt = (char *)(peVar2 + 1);
    mread(mf,peVar2->engr_txt,len);
    peVar2->nxt_engr = lev->lev_engr;
    lev->lev_engr = peVar2;
    while (*peVar2->engr_txt == ' ') {
      peVar2->engr_txt = peVar2->engr_txt + 1;
    }
    peVar2->engr_time = (ulong)moves;
  }
  panic("rest_engravings: engraving length too long! (%d)",(ulong)len);
}

Assistant:

void rest_engravings(struct memfile *mf, struct level *lev)
{
	struct engr *ep, *eprev, *enext;
	unsigned lth;

	mfmagic_check(mf, ENGRAVE_MAGIC);
	lev->lev_engr = NULL;
	while (1) {
		lth = mread32(mf);
		if (!lth) /* no more engravings */
		    break;
		if (lth > BUFSZ)
		    panic("rest_engravings: engraving length too long! (%d)", lth);

		ep = newengr(lth);
		ep->engr_lth = lth;
		ep->engr_x = mread8(mf);
		ep->engr_y = mread8(mf);
		ep->engr_type = mread8(mf);
		ep->engr_txt = (char *)(ep + 1);
		mread(mf, ep->engr_txt, lth);

		ep->nxt_engr = lev->lev_engr;
		lev->lev_engr = ep;
		while (ep->engr_txt[0] == ' ')
		    ep->engr_txt++;
		/* mark as finished for bones levels -- no problem for
		 * normal levels as the player must have finished engraving
		 * to be able to move again */
		ep->engr_time = moves;
	}

	/* engravings loaded above are reversed, so put it back in the right order */
	ep = lev->lev_engr;
	eprev = NULL;
	while (ep) {
		enext = ep->nxt_engr;
		ep->nxt_engr = eprev;
		eprev = ep;
		ep = enext;
	}
	lev->lev_engr = eprev;
}